

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O2

void __thiscall ON_XMLNodePrivate::RemoveAllProperties(ON_XMLNodePrivate *this)

{
  int iVar1;
  undefined4 extraout_var;
  ON_XMLProperty *pDelete;
  ON_XMLProperty *pOVar2;
  
  pOVar2 = this->m_first_property;
  if (pOVar2 != (ON_XMLProperty *)0x0) {
    while (pOVar2 != (ON_XMLProperty *)0x0) {
      iVar1 = (*pOVar2->_vptr_ON_XMLProperty[5])(pOVar2);
      (*pOVar2->_vptr_ON_XMLProperty[1])(pOVar2);
      pOVar2 = (ON_XMLProperty *)CONCAT44(extraout_var,iVar1);
    }
    this->m_first_property = (ON_XMLProperty *)0x0;
  }
  return;
}

Assistant:

void ON_XMLNodePrivate::RemoveAllProperties(void)
{
  if (nullptr == m_first_property)
    return;

  auto* pProp = m_first_property;
  while (nullptr != pProp)
  {
    auto* pDelete = pProp;
    pProp = pProp->Next();
    delete pDelete;
  }

  m_first_property = nullptr;
}